

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O0

MPP_RET mpp_init(MppCtx ctx,MppCtxType type,MppCodingType coding)

{
  MpiImpl *p;
  MPP_RET ret;
  MppCodingType coding_local;
  MppCtxType type_local;
  MppCtx ctx_local;
  
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","enter ctx %p type %d coding %d\n","mpp_init",ctx,(ulong)type,coding);
  }
  p._4_4_ = _check_mpp_ctx((MpiImpl *)ctx,"mpp_init");
  if (p._4_4_ == MPP_OK) {
    if (((int)type < 3) && ((int)coding < 0x7fffffff)) {
      p._4_4_ = Mpp::init(*(Mpp **)((long)ctx + 0x18),(EVP_PKEY_CTX *)(ulong)type);
      *(MppCtxType *)((long)ctx + 8) = type;
      *(MppCodingType *)((long)ctx + 0xc) = coding;
    }
    else {
      _mpp_log_l(2,"mpi","invalid input type %d coding %d\n","mpp_init",(ulong)type,(ulong)coding);
      p._4_4_ = MPP_ERR_UNKNOW;
    }
  }
  if ((mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","leave ctx %p ret %d\n","mpp_init",ctx,(ulong)(uint)p._4_4_);
  }
  return p._4_4_;
}

Assistant:

MPP_RET mpp_init(MppCtx ctx, MppCtxType type, MppCodingType coding)
{
    MPP_RET ret = MPP_OK;
    MpiImpl *p = (MpiImpl*)ctx;

    mpi_dbg_func("enter ctx %p type %d coding %d\n", ctx, type, coding);
    do {
        ret = check_mpp_ctx(p);
        if (ret)
            break;

        if (type >= MPP_CTX_BUTT ||
            coding >= MPP_VIDEO_CodingMax) {
            mpp_err_f("invalid input type %d coding %d\n", type, coding);
            ret = MPP_ERR_UNKNOW;
            break;
        }

        ret = p->ctx->init(type, coding);
        p->type     = type;
        p->coding   = coding;
    } while (0);

    mpi_dbg_func("leave ctx %p ret %d\n", ctx, ret);
    return ret;
}